

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

Gia_Man_t * Gia_ManSimPatGenMiter(Gia_Man_t *p,Vec_Wrd_t *vSims)

{
  ulong uVar1;
  Vec_Int_t *p_00;
  int nWords;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Man_t *p_01;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pObj;
  word *pIn1;
  int iVar6;
  
  nWords = vSims->nSize / p->nObjs;
  p_01 = Gia_ManStart(p->nObjs + p->vCos->nSize);
  Gia_ManHashStart(p_01);
  p->pObjs->Value = 0;
  for (iVar6 = 0; iVar6 < p->vCis->nSize; iVar6 = iVar6 + 1) {
    pGVar5 = Gia_ManCi(p,iVar6);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    pObj = Gia_ManAppendObj(p_01);
    uVar1 = *(ulong *)pObj;
    *(ulong *)pObj = uVar1 | 0x9fffffff;
    *(ulong *)pObj =
         uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
    p_00 = p_01->vCis;
    iVar2 = Gia_ObjId(p_01,pObj);
    Vec_IntPush(p_00,iVar2);
    iVar2 = Gia_ObjId(p_01,pObj);
    pGVar5->Value = iVar2 * 2;
  }
  for (iVar6 = 0; iVar6 < p->nObjs; iVar6 = iVar6 + 1) {
    pGVar5 = Gia_ManObj(p,iVar6);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar1 = *(ulong *)pGVar5;
    if ((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar1) {
      iVar2 = Abc_LitNotCond(pGVar5[-(uVar1 & 0x1fffffff)].Value,(uint)(uVar1 >> 0x1d) & 1);
      uVar4 = (uint)((ulong)*(undefined8 *)pGVar5 >> 0x20);
      iVar3 = Abc_LitNotCond(pGVar5[-(ulong)(uVar4 & 0x1fffffff)].Value,uVar4 >> 0x1d & 1);
      uVar4 = Gia_ManHashAnd(p_01,iVar2,iVar3);
      pGVar5->Value = uVar4;
    }
  }
  iVar6 = 0;
  for (iVar2 = 0; iVar2 < p->nObjs; iVar2 = iVar2 + 1) {
    pGVar5 = Gia_ManObj(p,iVar2);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      pIn1 = Vec_WrdEntryP(vSims,iVar6);
      iVar3 = Abc_TtIsConst0(pIn1,nWords);
      if (iVar3 != 0) {
        iVar3 = Abc_LitNotCond(pGVar5->Value,0);
        Gia_ManAppendCo(p_01,iVar3);
      }
      iVar3 = Abc_TtIsConst1(pIn1,nWords);
      if (iVar3 != 0) {
        iVar3 = Abc_LitNotCond(pGVar5->Value,1);
        Gia_ManAppendCo(p_01,iVar3);
      }
    }
    iVar6 = iVar6 + nWords;
  }
  Gia_ManHashStop(p_01);
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManSimPatGenMiter( Gia_Man_t * p, Vec_Wrd_t * vSims )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, nWords = Vec_WrdSize(vSims) / Gia_ManObjNum(p);
    pNew = Gia_ManStart( Gia_ManObjNum(p) + Gia_ManCoNum(p) );
    Gia_ManHashStart( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachAnd( p, pObj, i )
    {
        word * pSim = Vec_WrdEntryP(vSims, i*nWords);
        if ( Abc_TtIsConst0(pSim, nWords) )
            Gia_ManAppendCo( pNew, Abc_LitNotCond(pObj->Value, 0) );
        if ( Abc_TtIsConst1(pSim, nWords) )
            Gia_ManAppendCo( pNew, Abc_LitNotCond(pObj->Value, 1) );
    }
    Gia_ManHashStop( pNew );
    return pNew;
}